

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O3

int xmlSchemaCompareDurations(xmlSchemaValPtr x,xmlSchemaValPtr y)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  long lVar8;
  xmlChar *pxVar9;
  double dVar10;
  
  dVar10 = (x->value).date.sec - (y->value).date.sec;
  lVar2 = (long)(dVar10 / 86400.0);
  pxVar7 = (x->value).qname.uri + (lVar2 - (y->value).decimal.mi);
  dVar10 = dVar10 - (double)lVar2 * 86400.0;
  uVar3 = (long)(x->value).qname.name - (y->value).decimal.lo;
  if (uVar3 == 0) {
    if (pxVar7 != (xmlChar *)0x0) {
      return (uint)((long)pxVar7 >> 0x3f) | 1;
    }
    if ((dVar10 != 0.0) || (NAN(dVar10))) {
      return (uint)(0.0 <= dVar10) * 2 + -1;
    }
  }
  else {
    if ((long)uVar3 < 1) {
      if (((long)pxVar7 < 1) && (dVar10 <= 0.0)) {
        return -1;
      }
      uVar3 = -uVar3;
      iVar4 = -1;
    }
    else {
      if ((-1 < (long)pxVar7) && (0.0 <= dVar10)) {
        return 1;
      }
      pxVar7 = (xmlChar *)-(long)pxVar7;
      iVar4 = 1;
    }
    lVar2 = 0;
    if (uVar3 < 0xc) {
      lVar8 = 0;
    }
    else {
      if (0x4325c53ef368ebb < uVar3) {
        return -2;
      }
      lVar2 = (uVar3 / 0xc) * 0x16d;
      uVar5 = uVar3 / 0xc + 3 >> 2;
      lVar8 = uVar5 + lVar2;
      lVar2 = uVar5 + lVar2 + -1;
    }
    pxVar6 = (xmlChar *)(lVar2 + xmlSchemaCompareDurations::dayRange[0][uVar3 % 0xc]);
    pxVar9 = (xmlChar *)(lVar8 + xmlSchemaCompareDurations::dayRange[1][uVar3 % 0xc]);
    if ((pxVar9 != pxVar6) || (pxVar9 != pxVar7)) {
      if ((long)pxVar7 <= (long)pxVar9) {
        iVar1 = 2;
        if ((long)pxVar7 < (long)pxVar6) {
          iVar1 = iVar4;
        }
        return iVar1;
      }
      return -iVar4;
    }
  }
  return 0;
}

Assistant:

static int
xmlSchemaCompareDurations(xmlSchemaValPtr x, xmlSchemaValPtr y)
{
    long carry, mon, day;
    double sec;
    int invert = 1;
    long xmon, xday, myear, minday, maxday;
    static const long dayRange [2][12] = {
        { 0, 28, 59, 89, 120, 150, 181, 212, 242, 273, 303, 334, },
        { 0, 31, 62, 92, 123, 153, 184, 215, 245, 276, 306, 337} };

    if ((x == NULL) || (y == NULL))
        return -2;

    /* months */
    mon = x->value.dur.mon - y->value.dur.mon;

    /* seconds */
    sec = x->value.dur.sec - y->value.dur.sec;
    carry = (long)(sec / SECS_PER_DAY);
    sec -= ((double)carry) * SECS_PER_DAY;

    /* days */
    day = x->value.dur.day - y->value.dur.day + carry;

    /* easy test */
    if (mon == 0) {
        if (day == 0)
            if (sec == 0.0)
                return 0;
            else if (sec < 0.0)
                return -1;
            else
                return 1;
        else if (day < 0)
            return -1;
        else
            return 1;
    }

    if (mon > 0) {
        if ((day >= 0) && (sec >= 0.0))
            return 1;
        else {
            xmon = mon;
            xday = -day;
        }
    } else if ((day <= 0) && (sec <= 0.0)) {
        return -1;
    } else {
	invert = -1;
        xmon = -mon;
        xday = day;
    }

    myear = xmon / 12;
    if (myear == 0) {
	minday = 0;
	maxday = 0;
    } else {
        if (myear > LONG_MAX / 366)
            return -2;
        /* FIXME: This doesn't take leap year exceptions every 100/400 years
           into account. */
	maxday = 365 * myear + (myear + 3) / 4;
        /* FIXME: Needs to be calculated separately */
	minday = maxday - 1;
    }

    xmon = xmon % 12;
    minday += dayRange[0][xmon];
    maxday += dayRange[1][xmon];

    if ((maxday == minday) && (maxday == xday))
	return(0); /* can this really happen ? */
    if (maxday < xday)
        return(-invert);
    if (minday > xday)
        return(invert);

    /* indeterminate */
    return 2;
}